

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlReporter::EndGroup(XmlReporter *this,string *param_1,Totals *totals)

{
  XmlWriter *this_00;
  ScopedElement scoped;
  ScopedElement local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = &this->m_xml;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"OverallResults","");
  local_b8.m_writer = this_00;
  XmlWriter::startElement(this_00,&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"successes","");
  XmlWriter::writeAttribute<unsigned_long>(local_b8.m_writer,&local_70,(unsigned_long *)totals);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"failures","");
  XmlWriter::writeAttribute<unsigned_long>(local_b8.m_writer,&local_90,&(totals->assertions).failed)
  ;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"expectedFailures","");
  XmlWriter::writeAttribute<unsigned_long>
            (local_b8.m_writer,&local_b0,&(totals->assertions).failedButOk);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  XmlWriter::ScopedElement::~ScopedElement(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  XmlWriter::endElement(this_00);
  return;
}

Assistant:

virtual void EndGroup( const std::string&, const Totals& totals ) {
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", totals.assertions.passed )
                .writeAttribute( "failures", totals.assertions.failed )
                .writeAttribute( "expectedFailures", totals.assertions.failedButOk );
            m_xml.endElement();
        }